

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab7.c
# Opt level: O3

int feederBig(void)

{
  int iVar1;
  FILE *__stream;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar1 = -1;
  }
  else {
    fprintf(__stream,"%d\n",2000);
    fprintf(__stream,"%d\n",0x1e8098);
    uVar3 = 1;
    uVar5 = 2;
    uVar4 = uVar5;
    do {
      do {
        fprintf(__stream,"%d %d\n",uVar3,(ulong)uVar5);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x7d1);
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      uVar5 = uVar4 + 1;
      uVar4 = uVar5;
    } while (uVar2 != 2000);
    fclose(__stream);
    LabMemoryLimit = 0x7d4f50;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", N_MAX);
    fprintf(in, "%d\n", N_MAX*(N_MAX-1)/2);
    for (i = 0; i+1 < N_MAX; i++) {
        int j;
        for (j = i+1; j < N_MAX; j++) {
            fprintf(in, "%d %d\n", i+1, j+1);
        }
    }
    fclose(in);
    LabMemoryLimit = N_MAX * 10 + N_MAX * (N_MAX-1) + MIN_PROCESS_RSS_BYTES;
    return 0;
}